

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O1

void report_errors(void)

{
  qpdf_error p_Var1;
  int iVar2;
  
  iVar2 = qpdf_more_warnings(qpdf);
  while (iVar2 != 0) {
    p_Var1 = (qpdf_error)qpdf_next_warning(qpdf);
    print_error("warning",qpdf,p_Var1);
    iVar2 = qpdf_more_warnings(qpdf);
  }
  iVar2 = qpdf_has_error(qpdf);
  p_Var1 = (qpdf_error)qpdf_get_error(qpdf);
  if (iVar2 != 0) {
    iVar2 = qpdf_has_error(qpdf);
    if (iVar2 == 0) {
      print_error("error",qpdf,p_Var1);
      return;
    }
    __assert_fail("qpdf_has_error(qpdf) == QPDF_FALSE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x37,"void report_errors()");
  }
  if (p_Var1 != (qpdf_error)0x0) {
    __assert_fail("e == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3b,"void report_errors()");
  }
  iVar2 = qpdf_get_error_code(qpdf,0);
  if (iVar2 == 0) {
    qpdf_get_error_full_text(qpdf,0);
    qpdf_get_error_filename(qpdf,0);
    qpdf_get_error_file_position(qpdf,0);
    qpdf_get_error_message_detail(qpdf,0);
    return;
  }
  __assert_fail("qpdf_get_error_code(qpdf, e) == qpdf_e_success",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x3c,"void report_errors()");
}

Assistant:

static void
report_errors()
{
    qpdf_error e = 0;
    while (qpdf_more_warnings(qpdf)) {
        e = qpdf_next_warning(qpdf);
        print_error("warning", qpdf, e);
    }
    if (qpdf_has_error(qpdf)) {
        e = qpdf_get_error(qpdf);
        assert(qpdf_has_error(qpdf) == QPDF_FALSE);
        print_error("error", qpdf, e);
    } else {
        e = qpdf_get_error(qpdf);
        assert(e == 0);
        assert(qpdf_get_error_code(qpdf, e) == qpdf_e_success);
        // Call these to ensure that they can be called on a null
        // error pointer.
        (void)qpdf_get_error_full_text(qpdf, e);
        (void)qpdf_get_error_filename(qpdf, e);
        (void)qpdf_get_error_file_position(qpdf, e);
        (void)qpdf_get_error_message_detail(qpdf, e);
    }
}